

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blob.h
# Opt level: O0

void __thiscall ncnn::Blob::~Blob(Blob *this)

{
  string *in_RDI;
  
  ncnn::Mat::~Mat((Mat *)0x184b3c);
  std::__cxx11::string::~string(in_RDI);
  return;
}

Assistant:

class NCNN_EXPORT Blob
{
public:
    // empty
    Blob();

public:
#if NCNN_STRING
    // blob name
    std::string name;
#endif // NCNN_STRING
    // layer index which produce this blob as output
    int producer;
    // layer index which need this blob as input
    int consumer;
    // shape hint
    Mat shape;
}